

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O0

int mpt_library_detach(mpt_libhandle **handle)

{
  mpt_libhandle *ref;
  uintptr_t uVar1;
  int iVar2;
  uintptr_t uVar3;
  uintptr_t count;
  mpt_libhandle *lh;
  mpt_libhandle **handle_local;
  
  ref = *handle;
  if (ref != (mpt_libhandle *)0x0) {
    uVar1 = (ref->_ref)._val;
    if ((uVar1 != 0) && (uVar3 = __mpt_library_proxy_unref(&ref->_ref), uVar3 != 0)) {
      return 0;
    }
    if ((ref->addr != (void *)0x0) && (iVar2 = dlclose(ref->addr), iVar2 < 0)) {
      return -4;
    }
    if (uVar1 != 0) {
      free(ref);
    }
    *handle = (mpt_libhandle *)0x0;
  }
  return 0;
}

Assistant:

extern int mpt_library_detach(MPT_STRUCT(libhandle) **handle)
{
	MPT_STRUCT(libhandle) *lh;
	uintptr_t count;
	
	if (!(lh = *handle)) {
		return 0;
	}
	if ((count = lh->_ref._val)
	    && __mpt_library_proxy_unref(&lh->_ref)) {
		return 0;
	}
	if (lh->addr && dlclose(lh->addr) < 0) {
		return MPT_ERROR(BadOperation);
	}
	if (count) {
		free(lh);
	}
	*handle = 0;
	return 0;
}